

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# step.cpp
# Opt level: O3

bool __thiscall step::can_apply(step *this)

{
  action aVar1;
  bucket *pbVar2;
  bool bVar3;
  
  aVar1 = this->step_action;
  if (aVar1 == transfer) {
    if (this->bucket1->used == 0) {
      return false;
    }
    pbVar2 = this->bucket2;
  }
  else {
    if (aVar1 == empty) {
      bVar3 = this->bucket1->used == 0;
      goto LAB_00106134;
    }
    if (aVar1 != fill) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zabereer[P]water_crisis/step.cpp"
                    ,0x27,"bool step::can_apply() const");
    }
    pbVar2 = this->bucket1;
  }
  bVar3 = pbVar2->capacity == pbVar2->used;
LAB_00106134:
  return !bVar3;
}

Assistant:

bool step::can_apply() const
{
	switch (step_action) {
	case action::fill :
		return !bucket1->full();
	case action::empty :
		return !bucket1->empty();
	case action::transfer :
		return !bucket1->empty() && !bucket2->full();
	default:
		assert(false);
	}
	return false;
}